

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall tf::TFProfObserver::summary(TFProfObserver *this,ostream *os)

{
  pointer pvVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  iterator iVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ostream *poVar12;
  pointer *ppvVar13;
  pointer pvVar14;
  long *plVar15;
  ulong uVar16;
  pointer pvVar17;
  long lVar18;
  long *plVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  size_t *psVar23;
  size_t t;
  WorkerSummary ws;
  Summary summary;
  long local_270;
  long local_268;
  ostream *local_260;
  ulong local_258;
  ulong local_250;
  long local_248;
  ulong local_240;
  WorkerSummary local_238;
  undefined1 local_128 [224];
  pointer local_48;
  iterator iStack_40;
  WorkerSummary *local_38;
  
  lVar8 = 0;
  do {
    *(undefined8 *)(local_128 + lVar8) = 0;
    *(undefined8 *)(local_128 + lVar8 + 8) = 0;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0xe0);
  local_48 = (pointer)0x0;
  iStack_40._M_current = (WorkerSummary *)0x0;
  local_38 = (WorkerSummary *)0x0;
  pvVar14 = (this->_timeline).segments.
            super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = ((long)pvVar1 - (long)pvVar14 >> 3) * -0x5555555555555555;
  if (pvVar1 == pvVar14) {
    uVar22 = 0;
  }
  else {
    uVar16 = uVar9 + (uVar9 == 0);
    ppvVar13 = &(pvVar14->
                super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    uVar21 = 0;
    do {
      uVar22 = uVar21;
      if (*ppvVar13 != ((_Vector_impl_data *)(ppvVar13 + -1))->_M_start) break;
      uVar21 = uVar21 + 1;
      ppvVar13 = ppvVar13 + 3;
      uVar22 = uVar16;
    } while (uVar16 != uVar21);
  }
  if ((uVar22 != uVar9) &&
     (uVar22 < (ulong)(((long)(this->_timeline).segments.
                              super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_timeline).segments.
                              super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
     )) {
    local_260 = os;
    bVar5 = false;
    bVar4 = false;
    lVar20 = local_270;
    lVar8 = local_268;
    do {
      pvVar14 = (this->_timeline).segments.
                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_258 = uVar22;
      pvVar17 = pvVar14[uVar22].
                super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar14[uVar22].
                   super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                   ._M_impl.super__Vector_impl_data + 8) != pvVar17) {
        local_248 = uVar22 * 3;
        pvVar14 = pvVar14 + uVar22;
        uVar9 = 0;
        do {
          local_240 = uVar9;
          if (pvVar17[uVar9].super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>._M_impl.
              super__Vector_impl_data._M_start !=
              *(pointer *)
               ((long)&pvVar17[uVar9].super__Vector_base<tf::Segment,_std::allocator<tf::Segment>_>.
                       _M_impl.super__Vector_impl_data + 8)) {
            local_238.min_span = 0;
            local_238.max_span = 0;
            local_238.total_span = 0;
            lVar18 = 0x30;
            do {
              *(undefined8 *)((long)local_238.tsum._M_elems + lVar18 + -0x30) = 0;
              *(undefined8 *)((long)local_238.tsum._M_elems + lVar18 + -0x28) = 0;
              lVar18 = lVar18 + 0x20;
            } while (lVar18 != 0x110);
            local_238.id = local_258;
            local_238.level = uVar9;
            lVar18 = *(long *)&(pvVar14->
                               super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                               )._M_impl.super__Vector_impl_data;
            lVar2 = *(long *)(lVar18 + uVar9 * 0x18);
            lVar18 = *(long *)(lVar18 + 8 + uVar9 * 0x18);
            local_238.count = (lVar18 - lVar2 >> 3) * 0x6db6db6db6db6db7;
            if (lVar18 != lVar2) {
              local_238.total_span = 0;
              plVar15 = (long *)(lVar2 + 0x30);
              lVar18 = 0;
              do {
                plVar19 = plVar15 + -1;
                if (bVar5) {
                  if (lVar8 <= *plVar19) {
                    plVar19 = &local_268;
                  }
                }
                else {
                  bVar5 = true;
                }
                lVar8 = *plVar19;
                local_268 = lVar8;
                plVar19 = plVar15;
                bVar7 = true;
                if ((bVar4) && (bVar7 = bVar4, *plVar15 <= lVar20)) {
                  plVar19 = &local_270;
                }
                bVar4 = bVar7;
                lVar20 = *plVar19;
                local_270 = lVar20;
                local_250 = (*plVar15 - plVar15[-1]) / 1000;
                lVar10 = (long)(int)plVar15[-2];
                lVar11 = lVar10 * 0x20;
                lVar2 = *(long *)(local_128 + lVar11);
                *(long *)(local_128 + lVar11) = lVar2 + 1;
                *(ulong *)(local_128 + lVar11 + 8) = *(long *)(local_128 + lVar11 + 8) + local_250;
                psVar23 = &local_250;
                if ((lVar2 != 0) && (*(ulong *)(local_128 + lVar11 + 0x10) < local_250)) {
                  psVar23 = (size_t *)(local_128 + lVar11 + 0x10);
                }
                *(size_t *)(local_128 + lVar11 + 0x10) = *psVar23;
                psVar23 = &local_250;
                if ((lVar2 != 0) && (local_250 < *(ulong *)(local_128 + lVar11 + 0x18))) {
                  psVar23 = (size_t *)(local_128 + lVar11 + 0x18);
                }
                *(size_t *)(local_128 + lVar11 + 0x18) = *psVar23;
                local_238.total_span = local_238.total_span + local_250;
                psVar23 = &local_250;
                if (lVar18 == 0) {
                  local_238.min_span = local_250;
                }
                else {
                  if (local_250 <= local_238.min_span) {
                    local_238.min_span = local_250;
                  }
                  if (local_250 < local_238.max_span) {
                    psVar23 = &local_238.max_span;
                  }
                }
                local_238.max_span = *psVar23;
                sVar3 = local_238.tsum._M_elems[lVar10].count;
                local_238.tsum._M_elems[lVar10].count = sVar3 + 1;
                psVar23 = &local_238.tsum._M_elems[lVar10].total_span;
                *psVar23 = *psVar23 + local_250;
                psVar23 = &local_250;
                if ((sVar3 != 0) && (local_238.tsum._M_elems[lVar10].min_span < local_250)) {
                  psVar23 = &local_238.tsum._M_elems[lVar10].min_span;
                }
                local_238.tsum._M_elems[lVar10].min_span = *psVar23;
                psVar23 = &local_250;
                if ((sVar3 != 0) && (local_250 < local_238.tsum._M_elems[lVar10].max_span)) {
                  psVar23 = &local_238.tsum._M_elems[lVar10].max_span;
                }
                local_238.tsum._M_elems[lVar10].max_span = *psVar23;
                lVar18 = lVar18 + 1;
                plVar15 = plVar15 + 7;
              } while (local_238.count + (local_238.count == 0) != lVar18);
            }
            iVar6._M_current = iStack_40._M_current;
            if (iStack_40._M_current == local_38) {
              std::
              vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>
              ::_M_realloc_insert<tf::TFProfObserver::WorkerSummary_const&>
                        ((vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>
                          *)&local_48,iStack_40,&local_238);
            }
            else {
              memcpy(iStack_40._M_current,&local_238,0x110);
              iStack_40._M_current = iVar6._M_current + 1;
            }
          }
          uVar9 = local_240 + 1;
          pvVar14 = (pointer)((long)&(((this->_timeline).segments.
                                       super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                     )._M_impl.super__Vector_impl_data + local_248 * 8);
          pvVar17 = (pvVar14->
                    super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)(((long)*(pointer *)
                                         ((long)&(pvVar14->
                                                 super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                                 )._M_impl.super__Vector_impl_data + 8) -
                                  (long)pvVar17 >> 3) * -0x5555555555555555));
      }
      uVar22 = local_258 + 1;
      os = local_260;
    } while (uVar22 < (ulong)(((long)(this->_timeline).segments.
                                     super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->_timeline).segments.
                                     super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"==Observer ",0xb);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
  lVar8 = (long)(this->_timeline).segments.
                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_timeline).segments.
                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar8 != 0) {
    lVar8 = (lVar8 >> 3) * -0x5555555555555555;
    lVar8 = lVar8 + (ulong)(lVar8 == 0);
    do {
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," workers completed ",0x13);
  pvVar14 = (this->_timeline).segments.
            super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->_timeline).segments.
                super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar14;
  if (lVar8 != 0) {
    lVar8 = (lVar8 >> 3) * -0x5555555555555555;
    lVar20 = 0;
    do {
      lVar18 = (long)*(pointer *)
                      ((long)&pvVar14[lVar20].
                              super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar14[lVar20].
                         super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      if (lVar18 != 0) {
        lVar18 = (lVar18 >> 3) * -0x5555555555555555;
        lVar18 = lVar18 + (ulong)(lVar18 == 0);
        do {
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar8 + (ulong)(lVar8 == 0));
  }
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," tasks in ",10);
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," us\n",4);
  Summary::dump_tsum((Summary *)local_128,os);
  local_238.id = CONCAT71(local_238.id._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_238,1);
  Summary::dump_wsum((Summary *)local_128,os);
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

inline void TFProfObserver::summary(std::ostream& os) const {

  using namespace std::chrono;
  
  Summary summary;
  std::optional<observer_stamp_t> view_beg, view_end;

  // find the first non-empty worker
  size_t first;
  for(first = 0; first<_timeline.segments.size(); ++first) {
    if(_timeline.segments[first].size() > 0) { 
      break; 
    }
  }
  
  // not timeline data to dump
  if(first == _timeline.segments.size()) {
    goto end_of_summary;
  }

  for(size_t w=first; w<_timeline.segments.size(); w++) {
    for(size_t l=0; l<_timeline.segments[w].size(); l++) {

      if(_timeline.segments[w][l].empty()) {
        continue;
      }

      // worker w at level l
      WorkerSummary ws;
      ws.id = w;
      ws.level = l;
      ws.count = _timeline.segments[w][l].size();
      
      // scan all tasks at level l
      for(size_t i=0; i<_timeline.segments[w][l].size(); ++i) {
        
        // update the entire span
        auto& s = _timeline.segments[w][l][i];
        view_beg = view_beg ? (std::min)(*view_beg, s.beg) : s.beg;
        view_end = view_end ? (std::max)(*view_end, s.end) : s.end;
        
        // update the task summary
        size_t t = duration_cast<microseconds>(s.end - s.beg).count();

        auto& x = summary.tsum[static_cast<int>(s.type)];
        x.count += 1;
        x.total_span += t;
        x.min_span = (x.count == 1) ? t : (std::min)(t, x.min_span);
        x.max_span = (x.count == 1) ? t : (std::max)(t, x.max_span);

        // update the worker summary
        ws.total_span += t;
        ws.min_span = (i == 0) ? t : (std::min)(t, ws.min_span);
        ws.max_span = (i == 0) ? t : (std::max)(t, ws.max_span);

        auto&y = ws.tsum[static_cast<int>(s.type)];
        y.count += 1;
        y.total_span += t;
        y.min_span = (y.count == 1) ? t : (std::min)(t, y.min_span);
        y.max_span = (y.count == 1) ? t : (std::max)(t, y.max_span);
        
        // update the delay
        //if(i) {
        //  size_t d = duration_cast<nanoseconds>(
        //    s.beg - _timeline.segments[w][l][i-1].end
        //  ).count();
        //  ws.total_delay += d;
        //  ws.min_delay = (i == 1) ? d : std::min(ws.min_delay, d);
        //  ws.max_delay = (i == 1) ? d : std::max(ws.max_delay, d);
        //}
      }
      summary.wsum.push_back(ws);
    }
  }

  end_of_summary:

  size_t view = 0;
  if(view_beg && view_end) {
    view = duration_cast<microseconds>(*view_end - *view_beg).count();
  }

  os << "==Observer " << _timeline.uid << ": "
     << num_workers() << " workers completed "
     << num_tasks() << " tasks in "
     << view << " us\n";

  summary.dump(os);
}